

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

Error __thiscall asmjit::CodeHolder::resolveUnresolvedLinks(CodeHolder *this)

{
  long *plVar1;
  size_type *psVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  size_type sVar6;
  Value VVar7;
  void *pvVar8;
  bool bVar9;
  uint8_t uVar10;
  Error EVar11;
  ulong uVar12;
  Slot *pSVar13;
  Slot *pSVar14;
  uint *puVar15;
  ulong uVar16;
  uint8_t *puVar17;
  AddressTableEntry *pAVar18;
  uint extraout_EDX;
  uint extraout_EDX_00;
  long lVar19;
  uint64_t *out;
  undefined8 unaff_RBP;
  undefined8 uVar20;
  Value in_RSI;
  Value VVar21;
  Value VVar22;
  CodeHolder *pCVar23;
  ZoneAllocator *pZVar24;
  CodeHolder *pCVar25;
  uint uVar26;
  long lVar27;
  CodeHolder *pCVar28;
  Value VVar29;
  undefined8 uVar30;
  ulong *puVar31;
  undefined8 unaff_R14;
  Slot *pSVar32;
  Value allocator;
  bool bVar33;
  ulong auStack_1a0 [2];
  Value VStack_190;
  ulong uStack_188;
  Slot *pSStack_180;
  Value VStack_178;
  Value VStack_170;
  ulong uStack_168;
  CodeHolder *pCStack_160;
  Value VStack_158;
  code *pcStack_150;
  CodeHolder *pCStack_140;
  Error EStack_134;
  size_t sStack_130;
  long lStack_128;
  ulong uStack_120;
  CodeHolder *pCStack_118;
  ulong uStack_110;
  Value *pVStack_108;
  Value VStack_100;
  Value VStack_f8;
  undefined8 uStack_f0;
  CodeHolder *pCStack_e8;
  ZoneAllocator *pZStack_e0;
  ulong uStack_d8;
  undefined8 uStack_d0;
  size_t sStack_c0;
  uint8_t *puStack_b8;
  Slot *pSStack_b0;
  CodeHolder *pCStack_a8;
  long lStack_a0;
  ulong uStack_98;
  Error EStack_84;
  long lStack_80;
  CodeHolder *pCStack_78;
  Slot *pSStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  Slot *pSStack_58;
  undefined8 uStack_50;
  long *local_48;
  long *local_40;
  uint8_t *local_38;
  
  uVar30 = 0;
  if ((this->_unresolvedLinkCount != 0) &&
     (uVar12 = (ulong)(this->_labelEntries).super_ZoneVectorBase._size, uVar12 != 0)) {
    local_40 = (long *)(this->_labelEntries).super_ZoneVectorBase._data;
    local_48 = local_40 + uVar12;
    uVar30 = 0;
    pCVar25 = this;
    do {
      lVar19 = *local_40;
      if ((*(long *)(lVar19 + 0x20) != 0) && (*(Slot **)(lVar19 + 0x28) != (Slot *)0x0)) {
        pSVar14 = (Slot *)(lVar19 + 0x28);
        uVar12 = *(ulong *)(*(long *)(lVar19 + 0x20) + 0x10);
        bVar33 = CARRY8(uVar12,*(ulong *)(lVar19 + 0x18));
        puVar17 = (uint8_t *)(uVar12 + *(ulong *)(lVar19 + 0x18));
        unaff_R14 = CONCAT71((int7)((ulong)unaff_R14 >> 8),bVar33);
        pSVar32 = *(Slot **)(lVar19 + 0x28);
        local_38 = puVar17;
        do {
          uVar20 = uVar30;
          if (*(int *)((long)&pSVar32[1].next + 4) != -1) goto LAB_00114563;
          if ((this->_sections).super_ZoneVectorBase._size <= *(uint *)&pSVar32[1].next) {
            uStack_50 = 0x1145a2;
            resolveUnresolvedLinks();
LAB_001145a2:
            uStack_50 = 0x1145a7;
            resolveUnresolvedLinks();
LAB_001145a7:
            uStack_50 = 0x1145ac;
            resolveUnresolvedLinks();
LAB_001145ac:
            uStack_50 = 0x1145b1;
            resolveUnresolvedLinks();
            EStack_84 = 0xc;
            if ((pCVar25->_labelEntries).super_ZoneVectorBase._size <=
                *(uint *)((in_RSI.expression)->reserved + 1)) {
              return 0xc;
            }
            lVar19 = *(long *)((long)(pCVar25->_labelEntries).super_ZoneVectorBase._data +
                              (ulong)*(uint *)((in_RSI.expression)->reserved + 1) * 8);
            if (lVar19 == 0) {
              return 0xc;
            }
            uVar12 = (ulong)extraout_EDX;
            uVar26 = (pCVar25->_sections).super_ZoneVectorBase._size;
            if (uVar26 < extraout_EDX) {
              return 0x14;
            }
            if (*(long *)(lVar19 + 0x20) != 0) {
              return 0xe;
            }
            pCStack_78 = this;
            pSStack_70 = pSVar14;
            uStack_68 = uVar30;
            uStack_60 = unaff_R14;
            pSStack_58 = pSVar32;
            uStack_50 = unaff_RBP;
            if (extraout_EDX < uVar26) {
              lStack_80 = *(long *)((long)(pCVar25->_sections).super_ZoneVectorBase._data +
                                   uVar12 * 8);
              *(long *)(lVar19 + 0x20) = lStack_80;
              *(uint8_t **)(lVar19 + 0x18) = puVar17;
              if (*(Slot **)(lVar19 + 0x28) == (Slot *)0x0) {
                return 0;
              }
              EStack_84 = 0;
              pSVar14 = *(Slot **)(lVar19 + 0x28);
              pSVar32 = (Slot *)(lVar19 + 0x28);
              goto LAB_0011464e;
            }
            uStack_98 = 0x11474d;
            pCVar23 = pCVar25;
            bindLabel();
            uVar16 = (ulong)extraout_EDX_00;
            allocator.expression = (Expression *)&pCVar23->_allocator;
            uVar26 = (pCVar23->_relocations).super_ZoneVectorBase._size;
            puStack_b8 = puVar17;
            pSStack_b0 = pSVar14;
            pCStack_a8 = pCVar25;
            lStack_a0 = lVar19;
            uStack_98 = uVar12;
            if ((pCVar23->_relocations).super_ZoneVectorBase._capacity == uVar26) {
              uStack_d0 = 0x11478f;
              EVar11 = ZoneVectorBase::_grow
                                 (&(pCVar23->_relocations).super_ZoneVectorBase,
                                  (ZoneAllocator *)allocator.expression,8,1);
              if (EVar11 != 0) {
                return EVar11;
              }
              uVar26 = (pCVar23->_relocations).super_ZoneVectorBase._size;
            }
            VVar29.constant._4_4_ = 0;
            VVar29.constant._0_4_ = uVar26;
            if (uVar26 == 0xffffffff) {
              EVar11 = 0x17;
            }
            else {
              if (((ZoneAllocator *)allocator.expression)->_zone == (Zone *)0x0) {
                uStack_d0 = 0x11480f;
                newRelocEntry();
              }
              else {
                uStack_d0 = 0x1147b8;
                pZVar24 = (ZoneAllocator *)allocator;
                puVar15 = (uint *)ZoneAllocator::_allocZeroed
                                            ((ZoneAllocator *)allocator.expression,0x28,&sStack_c0);
                if (puVar15 != (uint *)0x0) {
                  *puVar15 = uVar26;
                  puVar15[1] = extraout_EDX_00 & 0xff;
                  puVar15[4] = 0xffffffff;
                  puVar15[5] = 0xffffffff;
                  uVar26 = (pCVar23->_relocations).super_ZoneVectorBase._size;
                  if (uVar26 < (pCVar23->_relocations).super_ZoneVectorBase._capacity) {
                    *(uint **)((long)(pCVar23->_relocations).super_ZoneVectorBase._data +
                              (ulong)uVar26 * 8) = puVar15;
                    psVar2 = &(pCVar23->_relocations).super_ZoneVectorBase._size;
                    *psVar2 = *psVar2 + 1;
                    *(uint **)in_RSI.expression = puVar15;
                    return 0;
                  }
                  uStack_d0 = 0x11481b;
                  newRelocEntry();
                  if ((ulong)*(uint32_t *)((long)(pZVar24 + 2) + 8) == 0) {
                    return 0;
                  }
                  lVar19 = 0;
                  pCVar25 = (CodeHolder *)0x0;
                  VVar21.constant = 0;
                  goto LAB_00114839;
                }
              }
              EVar11 = 1;
            }
            return EVar11;
          }
          puVar17 = (uint8_t *)(this->_sections).super_ZoneVectorBase._data;
          lVar19 = *(long *)(puVar17 + (ulong)*(uint *)&pSVar32[1].next * 8);
          pCVar25 = (CodeHolder *)pSVar32[2].next;
          if (*(CodeHolder **)(lVar19 + 0x50) <= pCVar25) goto LAB_001145a2;
          uVar12 = *(ulong *)(lVar19 + 0x10);
          puVar17 = &(pCVar25->_environment)._arch + uVar12;
          in_RSI.constant._1_7_ = (undefined7)((ulong)in_RSI >> 8);
          in_RSI.constant._0_1_ = CARRY8(uVar12,(ulong)pCVar25) || bVar33;
          unaff_RBP = 0x31;
          uVar20 = unaff_RBP;
          if (!CARRY8(uVar12,(ulong)pCVar25) && !bVar33) {
            in_RSI.constant._1_7_ = 0;
            in_RSI.constant._0_1_ = *(byte *)((long)&pSVar32[4].next + 3);
            if ((Section *)((long)*(CodeHolder **)(lVar19 + 0x50) - (long)pCVar25) < in_RSI.constant
               ) goto LAB_001145a7;
            in_RSI.expression =
                 (Expression *)(local_38 + ((long)&(pSVar32[3].next)->next - (long)puVar17));
            pCVar25 = (CodeHolder *)(&(pCVar25->_environment)._arch + *(long *)(lVar19 + 0x48));
            uStack_50 = 0x11453d;
            bVar9 = CodeWriterUtils::writeOffset
                              (pCVar25,in_RSI.constant,(OffsetFormat *)(pSVar32 + 4));
            if (!bVar9) goto LAB_00114563;
            pSVar13 = pSVar32->next;
            pSVar14->next = pSVar13;
            this->_unresolvedLinkCount = this->_unresolvedLinkCount - 1;
            if ((this->_allocator)._zone != (Zone *)0x0) {
              puVar17 = (uint8_t *)(this->_allocator)._slots[1];
              pSVar32->next = (Slot *)puVar17;
              (this->_allocator)._slots[1] = pSVar32;
              goto LAB_0011456c;
            }
            goto LAB_001145ac;
          }
LAB_00114563:
          pSVar13 = pSVar32->next;
          unaff_RBP = uVar20;
          pSVar14 = pSVar32;
          uVar30 = uVar20;
LAB_0011456c:
          pSVar32 = pSVar13;
        } while (pSVar13 != (Slot *)0x0);
      }
      local_40 = local_40 + 1;
    } while (local_40 != local_48);
  }
  return (Error)uVar30;
LAB_0011464e:
  pSVar13 = pSVar14;
  uVar26 = *(uint *)((long)&pSVar13[1].next + 4);
  if ((ulong)uVar26 != 0xffffffff) {
    if (uVar26 < (pCVar25->_relocations).super_ZoneVectorBase._size) {
      lVar19 = *(long *)((long)(pCVar25->_relocations).super_ZoneVectorBase._data +
                        (ulong)uVar26 * 8);
      plVar1 = (long *)(lVar19 + 0x20);
      *plVar1 = (long)(puVar17 + *plVar1);
      *(uint *)(lVar19 + 0x14) = extraout_EDX;
LAB_00114676:
      pSVar14 = pSVar13->next;
      pSVar32->next = pSVar14;
      pCVar25->_unresolvedLinkCount = pCVar25->_unresolvedLinkCount - 1;
      if ((pCVar25->_allocator)._zone != (Zone *)0x0) {
        pSVar13->next = (pCVar25->_allocator)._slots[1];
        (pCVar25->_allocator)._slots[1] = pSVar13;
        pSVar13 = pSVar32;
        goto LAB_001146f4;
      }
      uStack_98 = 0x114725;
      bindLabel();
    }
    uStack_98 = 0x11472a;
    bindLabel();
LAB_0011472a:
    uStack_98 = 0x11472f;
    bindLabel();
LAB_0011472f:
    uStack_98 = 0x114734;
    bindLabel();
    return 0x14;
  }
  if (*(uint *)&pSVar13[1].next == extraout_EDX) {
    pSVar14 = pSVar13[2].next;
    if (*(Slot **)(lStack_80 + 0x50) <= pSVar14) goto LAB_0011472a;
    if ((ulong)((long)*(Slot **)(lStack_80 + 0x50) - (long)pSVar14) <
        (ulong)*(byte *)((long)&pSVar13[4].next + 2)) goto LAB_0011472f;
    uStack_98 = 0x1146de;
    bVar33 = CodeWriterUtils::writeOffset
                       ((void *)((long)&pSVar14->next + *(long *)(lStack_80 + 0x48)),
                        ((long)puVar17 - (long)pSVar14) + (long)pSVar13[3].next,
                        (OffsetFormat *)(pSVar13 + 4));
    if (bVar33) goto LAB_00114676;
    pSVar14 = pSVar13->next;
    EStack_84 = 0x31;
  }
  else {
    pSVar14 = pSVar13->next;
  }
LAB_001146f4:
  pSVar32 = pSVar13;
  if (pSVar14 == (Slot *)0x0) {
    return EStack_84;
  }
  goto LAB_0011464e;
LAB_00114839:
  lVar27 = *(long *)(*(long *)(pZVar24 + 2) + lVar19);
  uVar12 = *(ulong *)(lVar27 + 0x50);
  if (*(ulong *)(lVar27 + 0x50) < *(ulong *)(lVar27 + 0x18)) {
    uVar12 = *(ulong *)(lVar27 + 0x18);
  }
  if (uVar12 != 0) {
    pCVar28 = (CodeHolder *)
              (-(ulong)*(uint *)(lVar27 + 8) &
              (long)(pCVar25->_allocator)._slots + ((ulong)*(uint *)(lVar27 + 8) - 0x49));
    if (pCVar28 < pCVar25) {
      uStack_d8 = 0x114893;
      codeSize();
      if ((CodeBuffer *)VVar21.constant == (CodeBuffer *)0xffffffffffffffff) {
        return 2;
      }
      pCVar25->_baseAddress = (uint64_t)VVar21;
      bVar3 = (pCVar25->_environment)._arch;
      VVar7 = (Value)pCVar25->_addressTableSection;
      uVar12 = 0;
      VVar22 = VVar21;
      pCVar28 = pCVar25;
      VStack_100 = in_RSI;
      VStack_f8 = VVar29;
      uStack_f0 = uVar30;
      pCStack_e8 = pCVar23;
      pZStack_e0 = (ZoneAllocator *)allocator;
      uStack_d8 = uVar16;
      if ((Section *)VVar7.constant == (Section *)0x0) {
        lStack_128 = 0;
      }
      else {
        VVar29.expression = (Expression *)(VVar7.constant + 0x48);
        if (*(size_t *)(VVar7.constant + 0x58) < (VVar7.label)->_offset) {
          if ((*(byte *)(VVar7.constant + 0x60) & 2) != 0) {
            return 9;
          }
          pcStack_150 = (code *)0x1148f6;
          VVar22.expression = VVar29.expression;
          EVar11 = CodeHolder_reserveInternal
                             (pCVar25,(CodeBuffer *)VVar29.expression,(VVar7.label)->_offset);
          in_RSI = VVar7;
          allocator = VVar21;
          if (EVar11 != 0) {
            return EVar11;
          }
        }
        lStack_128._0_1_ = *(uint8_t *)VVar29;
        lStack_128._1_1_ = ((uint8_t *)((long)VVar29 + 1))[0];
        lStack_128._2_1_ = ((uint8_t *)((long)VVar29 + 1))[1];
        lStack_128._3_1_ = ((uint8_t *)((long)VVar29 + 3))[0];
        lStack_128._4_1_ = ((uint8_t *)((long)VVar29 + 3))[1];
        lStack_128._5_1_ = ((uint8_t *)((long)VVar29 + 3))[2];
        lStack_128._6_1_ = ((uint8_t *)((long)VVar29 + 3))[3];
        lStack_128._7_1_ = ((uint8_t *)((long)VVar29 + 3))[4];
      }
      uVar16 = (ulong)(pCVar25->_relocations).super_ZoneVectorBase._size;
      if (uVar16 == 0) goto LAB_00114bc0;
      VVar29 = (Value)(pCVar25->_relocations).super_ZoneVectorBase._data;
      pVStack_108 = (Value *)((VVar29.expression)->valueType + uVar16 * 8 + -1);
      uStack_120 = (ulong)(bVar3 & 1) ^ 3;
      uVar12 = 0;
      pCStack_118 = pCVar25;
      goto LAB_00114950;
    }
    pCVar25 = (CodeHolder *)((long)(pCVar28->_allocator)._slots + (uVar12 - 0x48));
    VVar21._0_1_ = (byte)VVar21.constant | CARRY8((ulong)pCVar28,uVar12);
    VVar21.constant._1_7_ = 0;
  }
  lVar19 = lVar19 + 8;
  if ((ulong)*(uint32_t *)((long)(pZVar24 + 2) + 8) << 3 == lVar19) {
    return -(uint)((char)VVar21.constant != '\0') | (uint)pCVar25;
  }
  goto LAB_00114839;
LAB_00114950:
  allocator.constant = *VVar29.constant;
  iVar4 = *(int *)((allocator.expression)->reserved + 1);
  if (iVar4 == 0) goto LAB_00114b34;
  uVar26 = (pCVar25->_sections).super_ZoneVectorBase._size;
  if (uVar26 <= *(uint *)((allocator.expression)->value + 1)) {
    pcStack_150 = (code *)0x114c13;
    relocateToBase();
    return 0x18;
  }
  pvVar8 = (pCVar25->_sections).super_ZoneVectorBase._data;
  lVar19 = *(long *)((long)pvVar8 + (ulong)*(uint *)((allocator.expression)->value + 1) * 8);
  uVar5 = (allocator.label)->_parentId;
  if ((ulong)uVar5 == 0xffffffff) {
    lVar27 = 0;
  }
  else {
    if (uVar26 <= uVar5) {
      pcStack_150 = (code *)0x114c22;
      relocateToBase();
      return 2;
    }
    lVar27 = *(long *)((long)pvVar8 + (ulong)uVar5 * 8);
  }
  pCVar28 = (CodeHolder *)(allocator.label)->_section;
  uVar16 = (allocator.label)->_offset;
  if (*(ulong *)(lVar19 + 0x50) <= uVar16) {
    return 0x18;
  }
  EStack_134 = 0x18;
  out = (uint64_t *)(ulong)*(byte *)((long)(allocator.expression)->value + 2);
  if ((uint64_t *)(*(ulong *)(lVar19 + 0x50) - uVar16) < out) {
    return 0x18;
  }
  if (4 < iVar4 - 1U) {
    return 0x18;
  }
  VVar22 = (Value)((Value *)(lVar19 + 0x10))->expression;
  sStack_130 = *(size_t *)(lVar19 + 0x48);
  in_RSI.expression = (Expression *)(uVar16 + *(byte *)((long)(allocator.expression)->value + 4));
  pCStack_140 = pCVar28;
  switch(iVar4) {
  case 1:
    VVar22.expression = (Expression *)&pCStack_140;
    pcStack_150 = (code *)0x114a15;
    uStack_110 = uVar12;
    EVar11 = CodeHolder_evaluateExpression(pCVar28,VVar22.expression,out);
    uVar12 = uStack_110;
    pCVar25 = pCStack_118;
    if (EVar11 != 0) {
      return EVar11;
    }
    break;
  case 2:
    goto switchD_001149fb_caseD_2;
  case 3:
    if (lVar27 == 0) {
      return 0x18;
    }
    pCVar28 = (CodeHolder *)
              ((long)(pCVar28->_allocator)._slots +
              (long)(VVar21.expression[-3].valueType + *(long *)(lVar27 + 0x10) + -1));
    pCStack_140 = pCVar28;
    goto switchD_001149fb_caseD_2;
  case 4:
    VVar22.expression = (Expression *)((VVar22.expression)->valueType + (long)(VVar21.constant - 1))
    ;
    pCStack_140 = (CodeHolder *)
                  ((long)pCVar28 -
                  (long)((long)out + (long)((VVar22.expression)->valueType + (uVar16 - 1))));
    pCVar28 = pCStack_140;
    if ((bVar3 & 1) != 0) goto switchD_001149fb_caseD_2;
    pCVar28 = (CodeHolder *)((ulong)&pCStack_140[0x6bca1a]._addressTableSection >> 0x20);
    if (pCVar28 != (CodeHolder *)0x0) {
      return 0x19;
    }
    break;
  case 5:
    if (in_RSI.constant < (Section *)0x2) {
      return 0x18;
    }
    if (*(char *)((long)(allocator.expression)->value + 3) != '\x04') {
      return 0x18;
    }
    pCStack_140 = (CodeHolder *)
                  ((long)pCVar28 -
                  (long)((long)out +
                        (long)((VVar21.expression)->valueType +
                              (long)((VVar22.expression)->valueType + (uVar16 - 2)))));
    if ((CodeHolder *)(long)(int)pCStack_140 == pCStack_140) goto switchD_001149fb_caseD_2;
    pAVar18 = (pCVar25->_addressTableEntries)._root;
    while( true ) {
      if (pAVar18 == (AddressTableEntry *)0x0) {
        return 0x18;
      }
      pCVar23 = (CodeHolder *)pAVar18->_address;
      uVar26 = (uint)(pCVar23 >= pCVar28 && pCVar23 != pCVar28) - (uint)(pCVar23 < pCVar28);
      if (uVar26 == 0) break;
      pAVar18 = (AddressTableEntry *)
                ((pAVar18->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
                 _rbNodeData[uVar26 >> 0x1f] & 0xfffffffffffffffe);
    }
    if ((Section *)VVar7.constant == (Section *)0x0) goto LAB_00114c2e;
    uVar26 = pAVar18->_slot;
    if (uVar26 == 0xffffffff) {
      uVar26 = (uint)uVar12;
      pAVar18->_slot = uVar26;
      uVar12 = (ulong)(uVar26 + 1);
    }
    pCVar28 = (CodeHolder *)((ulong)uVar26 << ((byte)uStack_120 & 0x3f));
    pCStack_140 = (CodeHolder *)
                  (((long)(VVar7.expression)->value[1].expression -
                   (long)((VVar22.expression)->valueType + (uVar16 - 1) + (long)out)) +
                  (long)pCVar28);
    if ((CodeHolder *)(long)(int)pCStack_140 != pCStack_140) {
      return 0x19;
    }
    uVar10 = '\x15';
    if ((in_RSI.expression)->valueType[sStack_130 - 2] != 0xe8) {
      if ((in_RSI.expression)->valueType[sStack_130 - 2] != 0xe9) {
        return 0x18;
      }
      uVar10 = '%';
    }
    (in_RSI.expression)->valueType[sStack_130 - 3] = 0xff;
    (in_RSI.expression)->valueType[sStack_130 - 2] = uVar10;
    *(Section **)((long)(pCVar28->_allocator)._slots + lStack_128 + -0x48) =
         (allocator.label)->_section;
  }
LAB_00114aee:
  switch(*(undefined1 *)((long)(allocator.expression)->value + 3)) {
  case 1:
    (in_RSI.expression)->valueType[sStack_130 - 1] = (uint8_t)pCStack_140;
    break;
  case 2:
    *(undefined2 *)((in_RSI.expression)->valueType + (sStack_130 - 1)) = pCStack_140._0_2_;
    break;
  default:
    return EStack_134;
  case 4:
    *(undefined4 *)((in_RSI.expression)->valueType + (sStack_130 - 1)) = pCStack_140._0_4_;
    break;
  case 8:
    *(CodeHolder **)((in_RSI.expression)->valueType + (sStack_130 - 1)) = pCStack_140;
  }
LAB_00114b34:
  VVar29.expression = (Expression *)(VVar29.expression)->value;
  if ((Value *)VVar29.constant == pVStack_108) goto LAB_00114bc0;
  goto LAB_00114950;
switchD_001149fb_caseD_2:
  goto LAB_00114aee;
LAB_00114bc0:
  sVar6 = (pCVar25->_sectionsByOrder).super_ZoneVectorBase._size;
  if (sVar6 != 0) {
    if (*(Section **)
         ((long)(pCVar25->_sectionsByOrder).super_ZoneVectorBase._data + (ulong)(sVar6 - 1) * 8) ==
        (Section *)VVar7.constant) {
      uVar12 = (ulong)(uint)((int)uVar12 << (bVar3 & 1 ^ 3));
      *(ulong *)(VVar7.constant + 0x50) = uVar12;
      (VVar7.label)->_offset = uVar12;
    }
    return 0;
  }
  pcStack_150 = (code *)0x114c2e;
  relocateToBase();
LAB_00114c2e:
  pcStack_150 = CodeHolder_evaluateExpression;
  relocateToBase();
  lVar19 = 0;
  puVar31 = auStack_1a0;
  bVar33 = true;
  VStack_190 = VVar22;
  VStack_178 = in_RSI;
  VStack_170 = VVar29;
  uStack_168 = (ulong)bVar3;
  pCStack_160 = pCVar25;
  VStack_158 = allocator;
  pcStack_150 = (code *)uVar12;
  do {
    bVar9 = bVar33;
    pSVar14 = (Slot *)(ulong)*(byte *)((long)(pCVar28->_allocator)._slots + lVar19 + -0x47);
    if ((Slot *)0x3 < pSVar14) {
      return 3;
    }
    switch(pSVar14) {
    case (Slot *)0x1:
      pSVar14 = (pCVar28->_allocator)._slots[lVar19 + -8];
      break;
    case (Slot *)0x2:
      pSVar14 = (pCVar28->_allocator)._slots[lVar19 + -8];
      pSVar32 = pSVar14[4].next;
      if (pSVar32 == (Slot *)0x0) {
        return 0x43;
      }
      pSVar14 = (Slot *)((long)&(pSVar32[2].next)->next + (long)&(pSVar14[3].next)->next);
      break;
    case (Slot *)0x3:
      EVar11 = CodeHolder_evaluateExpression
                         ((CodeHolder *)(pCVar28->_allocator)._slots[lVar19 + -8],
                          (Expression *)&pSStack_180,
                          (uint64_t *)
                          ((long)&switchD_00114c75::switchdataD_00136004 +
                          (long)(int)(&switchD_00114c75::switchdataD_00136004)[(long)pSVar14]));
      pSVar14 = pSStack_180;
      if (EVar11 != 0) {
        return EVar11;
      }
    }
    *puVar31 = (ulong)pSVar14;
    lVar19 = 1;
    puVar31 = &uStack_188;
    bVar33 = false;
  } while (bVar9);
  switch((pCVar28->_environment)._arch) {
  case '\0':
    uVar12 = uStack_188 + auStack_1a0[0];
    break;
  case '\x01':
    uVar12 = auStack_1a0[0] - uStack_188;
    break;
  case '\x02':
    uVar12 = uStack_188 * auStack_1a0[0];
    break;
  case '\x03':
    auStack_1a0[0] = auStack_1a0[0] << ((byte)uStack_188 & 0x3f);
    goto LAB_00114d20;
  case '\x04':
    auStack_1a0[0] = auStack_1a0[0] >> ((byte)uStack_188 & 0x3f);
LAB_00114d20:
    uVar12 = 0;
    if (uStack_188 < 0x40) {
      uVar12 = auStack_1a0[0];
    }
    break;
  case '\x05':
    uVar12 = 0x3f;
    if (uStack_188 < 0x3f) {
      uVar12 = uStack_188;
    }
    uVar12 = (long)auStack_1a0[0] >> ((byte)uVar12 & 0x3f);
    break;
  default:
    return 3;
  }
  (VStack_190.expression)->opType = (char)uVar12;
  (VStack_190.expression)->valueType[0] = (char)(uVar12 >> 8);
  (VStack_190.expression)->valueType[1] = (char)(uVar12 >> 0x10);
  (VStack_190.expression)->reserved[0] = (char)(uVar12 >> 0x18);
  (VStack_190.expression)->reserved[1] = (char)(uVar12 >> 0x20);
  (VStack_190.expression)->reserved[2] = (char)(uVar12 >> 0x28);
  (VStack_190.expression)->reserved[3] = (char)(uVar12 >> 0x30);
  (VStack_190.expression)->reserved[4] = (char)(uVar12 >> 0x38);
  return 0;
}

Assistant:

ASMJIT_API Error CodeHolder::resolveUnresolvedLinks() noexcept {
  if (!hasUnresolvedLinks())
    return kErrorOk;

  Error err = kErrorOk;
  for (LabelEntry* le : labelEntries()) {
    if (!le->isBound())
      continue;

    LabelLinkIterator link(le);
    if (link) {
      Support::FastUInt8 of = 0;
      Section* toSection = le->section();
      uint64_t toOffset = Support::addOverflow(toSection->offset(), le->offset(), &of);

      do {
        uint32_t linkSectionId = link->sectionId;
        if (link->relocId == Globals::kInvalidId) {
          Section* fromSection = sectionById(linkSectionId);
          size_t linkOffset = link->offset;

          CodeBuffer& buf = _sections[linkSectionId]->buffer();
          ASMJIT_ASSERT(linkOffset < buf.size());

          // Calculate the offset relative to the start of the virtual base.
          Support::FastUInt8 localOF = of;
          uint64_t fromOffset = Support::addOverflow<uint64_t>(fromSection->offset(), linkOffset, &localOF);
          int64_t displacement = int64_t(toOffset - fromOffset + uint64_t(int64_t(link->rel)));

          if (!localOF) {
            ASMJIT_ASSERT(size_t(linkOffset) < buf.size());
            ASMJIT_ASSERT(buf.size() - size_t(linkOffset) >= link->format.valueSize());

            // Overwrite a real displacement in the CodeBuffer.
            if (CodeWriterUtils::writeOffset(buf._data + linkOffset, displacement, link->format)) {
              link.resolveAndNext(this);
              continue;
            }
          }

          err = DebugUtils::errored(kErrorInvalidDisplacement);
          // Falls through to `link.next()`.
        }

        link.next();
      } while (link);
    }
  }

  return err;
}